

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_get_topic(connectdata *conn,char **topic,size_t *topiclen)

{
  Curl_easy *data;
  char *__s;
  CURLcode CVar1;
  size_t sVar2;
  
  data = conn->data;
  __s = (data->state).up.path;
  sVar2 = strlen(__s);
  if (1 < sVar2) {
    CVar1 = Curl_urldecode(data,__s + 1,0,topic,topiclen,REJECT_NADA);
    return CVar1;
  }
  Curl_failf(data,"Error: No topic specified.");
  return CURLE_URL_MALFORMAT;
}

Assistant:

static CURLcode mqtt_get_topic(struct connectdata *conn,
                               char **topic, size_t *topiclen)
{
  CURLcode result = CURLE_OK;
  char *path = conn->data->state.up.path;

  if(strlen(path) > 1) {
    result = Curl_urldecode(conn->data, path + 1, 0, topic, topiclen,
                            REJECT_NADA);
  }
  else {
    failf(conn->data, "Error: No topic specified.");
    result = CURLE_URL_MALFORMAT;
  }
  return result;
}